

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O1

bool CheckDeprecatedFlags(AActor *actor,PClassActor *info,int index)

{
  DmgFactors *pDVar1;
  PClass *pPVar2;
  long *plVar3;
  PClass *pPVar4;
  long *plVar5;
  bool bVar6;
  byte bVar7;
  double dVar8;
  FName local_c;
  
  switch(index) {
  case 1:
    bVar6 = (actor->DamageType).super_FName.Index == 0xa4;
    break;
  case 2:
    bVar6 = (actor->DamageType).super_FName.Index == 0x33;
    break;
  case 3:
    dVar8 = 0.125;
    goto LAB_0051d6e1;
  case 4:
    bVar7 = -(actor->meleethreshold == 196.0);
    goto LAB_0051d6ea;
  case 5:
    bVar7 = -(actor->maxtargetrange == 896.0);
    goto LAB_0051d6ea;
  case 6:
    pPVar2 = (PClass *)actor[1].super_DThinker.PrevThinker;
    local_c.Index = FName::NameManager::FindName(&FName::NameData,"PickupFlash",true);
    pPVar4 = PClass::FindClass(&local_c);
    bVar6 = pPVar2 == pPVar4;
    break;
  case 7:
    dVar8 = 0.25;
LAB_0051d6e1:
    bVar7 = -(dVar8 == actor->Gravity);
LAB_0051d6ea:
    bVar6 = (bool)(bVar7 & 1);
    break;
  case 8:
    pDVar1 = info->DamageFactors;
    if (pDVar1 != (DmgFactors *)0x0) {
      plVar3 = (long *)((long)&((pDVar1->
                                super_TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>
                                ).Nodes)->Next +
                       (ulong)(((pDVar1->
                                super_TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>
                                ).Size - 1 & 0xa4) * 0x18));
      do {
        plVar5 = plVar3;
        if ((plVar5 == (long *)0x0) || ((long *)*plVar5 == (long *)0x1)) {
          plVar5 = (long *)0x0;
          break;
        }
        plVar3 = (long *)*plVar5;
      } while ((int)plVar5[1] != 0xa4);
      if (plVar5 != (long *)0x0) {
        bVar7 = -((double)plVar5[2] == 0.5);
        goto LAB_0051d6ea;
      }
    }
  default:
    bVar6 = false;
    break;
  case 9:
    bVar6 = ((actor->BounceFlags).Value & 0x10ef) == 0xc6;
    break;
  case 10:
    bVar6 = ((actor->BounceFlags).Value & 0x10ef) == 0x8f;
    break;
  case 0xb:
    bVar6 = ((actor->BounceFlags).Value & 0x10ef) == 0xaf;
    break;
  case 0xc:
    bVar6 = *(int *)&actor[1].super_DThinker.super_DObject.ObjNext == 0;
  }
  return bVar6;
}

Assistant:

bool CheckDeprecatedFlags(const AActor *actor, PClassActor *info, int index)
{
	// A deprecated flag is false if
	// a) it hasn't been added here
	// b) any property of the actor differs from what it would be after setting the flag using HandleDeprecatedFlags

	// Deprecated flags are normally replaced by something more flexible, which means a multitude of related configurations
	// will report "false".

	switch (index)
	{
	case DEPF_FIREDAMAGE:
		return actor->DamageType == NAME_Fire;
	case DEPF_ICEDAMAGE:
		return actor->DamageType == NAME_Ice;
	case DEPF_LOWGRAVITY:
		return actor->Gravity == 1./8;
	case DEPF_SHORTMISSILERANGE:
		return actor->maxtargetrange == 896.;
	case DEPF_LONGMELEERANGE:
		return actor->meleethreshold == 196.;
	case DEPF_QUARTERGRAVITY:
		return actor->Gravity == 1./4;
	case DEPF_FIRERESIST:
		if (info->DamageFactors)
		{
			double *df = info->DamageFactors->CheckKey(NAME_Fire);
			return df && (*df) == 0.5;
		}
		return false;

	case DEPF_HERETICBOUNCE:
		return (actor->BounceFlags & (BOUNCE_TypeMask|BOUNCE_UseSeeSound)) == BOUNCE_HereticCompat;

	case DEPF_HEXENBOUNCE:
		return (actor->BounceFlags & (BOUNCE_TypeMask|BOUNCE_UseSeeSound)) == BOUNCE_HexenCompat;
	
	case DEPF_DOOMBOUNCE:
		return (actor->BounceFlags & (BOUNCE_TypeMask|BOUNCE_UseSeeSound)) == BOUNCE_DoomCompat;

	case DEPF_PICKUPFLASH:
		return static_cast<const AInventory*>(actor)->PickupFlash == PClass::FindClass("PickupFlash");
		// A pure name lookup may or may not be more efficient, but I know no static identifier for PickupFlash.

	case DEPF_INTERHUBSTRIP:
		return !(static_cast<const AInventory*>(actor)->InterHubAmount);
	}

	return false; // Any entirely unknown flag is not set
}